

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# npc.cpp
# Opt level: O3

void __thiscall NPC::Damage(NPC *this,Character *from,int amount,int spell_id)

{
  list<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
  *plVar1;
  size_t *psVar2;
  _List_node_base **pp_Var3;
  World *pWVar4;
  Character *this_00;
  bool bVar5;
  int iVar6;
  int iVar7;
  mapped_type *this_01;
  NPC_Data *pNVar8;
  ENF_Data *pEVar9;
  _List_node_base *p_Var10;
  _List_node_base *p_Var11;
  int iVar12;
  PacketFamily family;
  list<Character_*,_std::allocator<Character_*>_> *plVar13;
  double dVar14;
  _List_node_base *p_Var15;
  PacketBuilder builder;
  undefined1 local_60 [48];
  
  iVar6 = this->hp;
  if (amount <= this->hp) {
    iVar6 = amount;
  }
  pWVar4 = this->map->world;
  local_60._0_8_ = local_60 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"LimitDamage","");
  this_01 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&pWVar4->config,(key_type *)local_60);
  bVar5 = util::variant::GetBool(this_01);
  if ((undefined1 *)local_60._0_8_ != local_60 + 0x10) {
    operator_delete((void *)local_60._0_8_,local_60._16_8_ + 1);
  }
  if (bVar5) {
    amount = iVar6;
  }
  pNVar8 = World::GetNpcData(this->map->world,(short)this->id);
  pEVar9 = NPC_Data::ENF(pNVar8);
  if (pEVar9->type == Passive) {
LAB_0017a3b7:
    iVar12 = this->hp - iVar6;
    iVar7 = amount;
  }
  else {
    pNVar8 = World::GetNpcData(this->map->world,(short)this->id);
    pEVar9 = NPC_Data::ENF(pNVar8);
    iVar12 = 0;
    iVar7 = 0;
    if (pEVar9->type == Aggressive) goto LAB_0017a3b7;
  }
  this->hp = iVar12;
  iVar12 = this->totaldamage + iVar6;
  if (this->totaldamage < iVar12) {
    this->totaldamage = iVar12;
  }
  p_Var10 = (_List_node_base *)operator_new(0x18);
  plVar1 = &this->damagelist;
  p_Var15 = (this->damagelist).
            super__List_base<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
            ._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var15 != (_List_node_base *)plVar1) {
    bVar5 = false;
    do {
      while (p_Var11 = p_Var15[1]._M_next, (Character *)p_Var11->_M_next == from) {
        iVar12 = *(int *)&p_Var11->_M_prev + iVar6;
        if (*(int *)&p_Var11->_M_prev < iVar12) {
          *(int *)&p_Var11->_M_prev = iVar12;
        }
        dVar14 = Timer::GetTime();
        p_Var15[1]._M_next[1]._M_next = (_List_node_base *)dVar14;
        p_Var15 = p_Var15->_M_next;
        bVar5 = true;
        if (p_Var15 == (_List_node_base *)plVar1) goto LAB_0017a48b;
      }
      p_Var15 = p_Var15->_M_next;
    } while (p_Var15 != (_List_node_base *)plVar1);
    if (bVar5) goto LAB_0017a48b;
  }
  p_Var10->_M_next = (_List_node_base *)from;
  *(int *)&p_Var10->_M_prev = iVar6;
  p_Var15 = (_List_node_base *)Timer::GetTime();
  p_Var10[1]._M_next = p_Var15;
  p_Var15 = p_Var10->_M_next;
  p_Var11 = (_List_node_base *)operator_new(0x18);
  p_Var11[1]._M_next = (_List_node_base *)this;
  std::__detail::_List_node_base::_M_hook(p_Var11);
  pp_Var3 = &p_Var15[0x38]._M_prev;
  *pp_Var3 = (_List_node_base *)((long)&(*pp_Var3)->_M_next + 1);
  p_Var15 = (_List_node_base *)operator_new(0x18);
  p_Var15[1]._M_next = p_Var10;
  std::__detail::_List_node_base::_M_hook(p_Var15);
  psVar2 = &(this->damagelist).
            super__List_base<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
            ._M_impl._M_node._M_size;
  *psVar2 = *psVar2 + 1;
  p_Var10 = (_List_node_base *)0x0;
LAB_0017a48b:
  if (this->hp < 1) {
    Killed(this,from,iVar7,spell_id);
  }
  else {
    family = PACKET_CAST;
    if (spell_id == -1) {
      family = PACKET_NPC;
    }
    PacketBuilder::PacketBuilder((PacketBuilder *)local_60,family,PACKET_REPLY,0xe);
    if (spell_id != -1) {
      PacketBuilder::AddShort((PacketBuilder *)local_60,spell_id);
    }
    iVar6 = Character::PlayerID(from);
    PacketBuilder::AddShort((PacketBuilder *)local_60,iVar6);
    PacketBuilder::AddChar((PacketBuilder *)local_60,(uint)from->direction);
    PacketBuilder::AddShort((PacketBuilder *)local_60,(uint)this->index);
    PacketBuilder::AddThree((PacketBuilder *)local_60,iVar7);
    iVar6 = this->hp;
    pNVar8 = World::GetNpcData(this->map->world,(short)this->id);
    pEVar9 = NPC_Data::ENF(pNVar8);
    iVar7 = (int)(((double)iVar6 / (double)pEVar9->hp) * 100.0);
    iVar6 = 0;
    if (0 < iVar7) {
      iVar6 = iVar7;
    }
    iVar7 = 100;
    if (iVar6 < 100) {
      iVar7 = iVar6;
    }
    PacketBuilder::AddShort((PacketBuilder *)local_60,iVar7);
    if (spell_id == -1) {
      PacketBuilder::AddChar((PacketBuilder *)local_60,1);
    }
    else {
      PacketBuilder::AddShort((PacketBuilder *)local_60,from->tp);
    }
    p_Var15 = (this->map->characters).super__List_base<Character_*,_std::allocator<Character_*>_>.
              _M_impl._M_node.super__List_node_base._M_next;
    plVar13 = &this->map->characters;
    if (p_Var15 != (_List_node_base *)plVar13) {
      do {
        this_00 = (Character *)p_Var15[1]._M_next;
        bVar5 = Character::InRange(this_00,this);
        if (bVar5) {
          Character::Send(this_00,(PacketBuilder *)local_60);
        }
        p_Var15 = p_Var15->_M_next;
      } while (p_Var15 != (_List_node_base *)plVar13);
    }
    PacketBuilder::~PacketBuilder((PacketBuilder *)local_60);
  }
  if (p_Var10 != (_List_node_base *)0x0) {
    operator_delete(p_Var10,0x18);
  }
  return;
}

Assistant:

void NPC::Damage(Character *from, int amount, int spell_id)
{
	int limitamount = std::min(this->hp, amount);

	if (this->map->world->config["LimitDamage"])
	{
		amount = limitamount;
	}

	if (this->ENF().type == ENF::Passive || this->ENF().type == ENF::Aggressive)
	{
		this->hp -= limitamount;
	}
	else
	{
		this->hp = 0;
		amount = 0;
	}

	if (this->totaldamage + limitamount > this->totaldamage)
		this->totaldamage += limitamount;

	std::unique_ptr<NPC_Opponent> opponent(new NPC_Opponent);
	bool found = false;

	UTIL_FOREACH_CREF(this->damagelist, checkopp)
	{
		if (checkopp->attacker == from)
		{
			found = true;

			if (checkopp->damage + limitamount > checkopp->damage)
				checkopp->damage += limitamount;

			checkopp->last_hit = Timer::GetTime();
		}
	}

	if (!found)
	{
		opponent->attacker = from;
		opponent->damage = limitamount;
		opponent->last_hit = Timer::GetTime();
		opponent->attacker->unregister_npc.push_back(this);
		this->damagelist.emplace_back(std::move(opponent));
	}

	if (this->hp > 0)
	{
		PacketBuilder builder(spell_id == -1 ? PACKET_NPC : PACKET_CAST, PACKET_REPLY, 14);

		if (spell_id != -1)
			builder.AddShort(spell_id);

		builder.AddShort(from->PlayerID());
		builder.AddChar(from->direction);
		builder.AddShort(this->index);
		builder.AddThree(amount);
		builder.AddShort(util::clamp<int>(double(this->hp) / double(this->ENF().hp) * 100.0, 0, 100));

		if (spell_id != -1)
			builder.AddShort(from->tp);
		else
			builder.AddChar(1); // ?

		UTIL_FOREACH(this->map->characters, character)
		{
			if (character->InRange(this))
			{
				character->Send(builder);
			}
		}
	}
	else
	{
		this->Killed(from, amount, spell_id);
		// *this may not be valid here
		return;
	}
}